

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O0

int TRUST_TOKEN_CLIENT_finish_redemption
              (TRUST_TOKEN_CLIENT *ctx,uint8_t **out_rr,size_t *out_rr_len,uint8_t **out_sig,
              size_t *out_sig_len,uint8_t *response,size_t response_len)

{
  int iVar1;
  size_t sVar2;
  uint8_t *sig_00;
  uint8_t *data;
  size_t len;
  bool local_b9;
  size_t local_b8;
  size_t sig_len;
  size_t srr_len;
  uint8_t *sig_buf;
  uint8_t *srr_buf;
  undefined1 local_90 [4];
  int sig_ok;
  EVP_MD_CTX md_ctx;
  CBS sig;
  CBS srr;
  CBS in;
  uint8_t *response_local;
  size_t *out_sig_len_local;
  uint8_t **out_sig_local;
  size_t *out_rr_len_local;
  uint8_t **out_rr_local;
  TRUST_TOKEN_CLIENT *ctx_local;
  
  CBS_init((CBS *)&srr.len,response,response_len);
  if (ctx->method->has_srr == 0) {
    iVar1 = CBS_stow((CBS *)&srr.len,out_rr,out_rr_len);
    if (iVar1 == 0) {
      return 0;
    }
    *out_sig = (uint8_t *)0x0;
    *out_sig_len = 0;
    return 1;
  }
  iVar1 = CBS_get_u16_length_prefixed((CBS *)&srr.len,(CBS *)&sig.len);
  if (((iVar1 == 0) ||
      (iVar1 = CBS_get_u16_length_prefixed((CBS *)&srr.len,(CBS *)&md_ctx.pctx_ops), iVar1 == 0)) ||
     (sVar2 = CBS_len((CBS *)&srr.len), sVar2 != 0)) {
    ERR_put_error(0x20,0,0x67,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,399);
    return 0;
  }
  if (ctx->srr_key == (EVP_PKEY *)0x0) {
    ERR_put_error(0x20,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0x194);
    return 0;
  }
  EVP_MD_CTX_init((EVP_MD_CTX *)local_90);
  iVar1 = EVP_DigestVerifyInit
                    ((EVP_MD_CTX *)local_90,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,(ENGINE *)0x0,
                     (EVP_PKEY *)ctx->srr_key);
  local_b9 = false;
  if (iVar1 != 0) {
    sig_00 = CBS_data((CBS *)&md_ctx.pctx_ops);
    sVar2 = CBS_len((CBS *)&md_ctx.pctx_ops);
    data = CBS_data((CBS *)&sig.len);
    len = CBS_len((CBS *)&sig.len);
    iVar1 = EVP_DigestVerify((EVP_MD_CTX *)local_90,sig_00,sVar2,data,len);
    local_b9 = iVar1 != 0;
  }
  srr_buf._4_4_ = (uint)local_b9;
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)local_90);
  if (srr_buf._4_4_ == 0) {
    ERR_put_error(0x20,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0x1a0);
    return 0;
  }
  sig_buf = (uint8_t *)0x0;
  srr_len = 0;
  iVar1 = CBS_stow((CBS *)&sig.len,&sig_buf,&sig_len);
  if ((iVar1 != 0) &&
     (iVar1 = CBS_stow((CBS *)&md_ctx.pctx_ops,(uint8_t **)&srr_len,&local_b8), iVar1 != 0)) {
    *out_rr = sig_buf;
    *out_rr_len = sig_len;
    *out_sig = (uint8_t *)srr_len;
    *out_sig_len = local_b8;
    return 1;
  }
  OPENSSL_free(sig_buf);
  OPENSSL_free((void *)srr_len);
  return 0;
}

Assistant:

int TRUST_TOKEN_CLIENT_finish_redemption(TRUST_TOKEN_CLIENT *ctx,
                                         uint8_t **out_rr, size_t *out_rr_len,
                                         uint8_t **out_sig, size_t *out_sig_len,
                                         const uint8_t *response,
                                         size_t response_len) {
  CBS in, srr, sig;
  CBS_init(&in, response, response_len);
  if (!ctx->method->has_srr) {
    if (!CBS_stow(&in, out_rr, out_rr_len)) {
      return 0;
    }

    *out_sig = NULL;
    *out_sig_len = 0;
    return 1;
  }

  if (!CBS_get_u16_length_prefixed(&in, &srr) ||
      !CBS_get_u16_length_prefixed(&in, &sig) || CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_ERROR);
    return 0;
  }

  if (ctx->srr_key == NULL) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_NO_SRR_KEY_CONFIGURED);
    return 0;
  }

  EVP_MD_CTX md_ctx;
  EVP_MD_CTX_init(&md_ctx);
  int sig_ok = EVP_DigestVerifyInit(&md_ctx, NULL, NULL, NULL, ctx->srr_key) &&
               EVP_DigestVerify(&md_ctx, CBS_data(&sig), CBS_len(&sig),
                                CBS_data(&srr), CBS_len(&srr));
  EVP_MD_CTX_cleanup(&md_ctx);

  if (!sig_ok) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_SRR_SIGNATURE_ERROR);
    return 0;
  }

  uint8_t *srr_buf = NULL, *sig_buf = NULL;
  size_t srr_len, sig_len;
  if (!CBS_stow(&srr, &srr_buf, &srr_len) ||
      !CBS_stow(&sig, &sig_buf, &sig_len)) {
    OPENSSL_free(srr_buf);
    OPENSSL_free(sig_buf);
    return 0;
  }

  *out_rr = srr_buf;
  *out_rr_len = srr_len;
  *out_sig = sig_buf;
  *out_sig_len = sig_len;
  return 1;
}